

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::AddTargetAlias
          (cmGlobalNinjaGenerator *this,string *alias,cmGeneratorTarget *target,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  pointer pbVar4;
  int iVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  const_iterator cVar8;
  pointer __k;
  string *config2;
  _Alloc_hider __k_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>,_bool>
  pVar9;
  cmNinjaDeps outputs;
  TargetAlias ta;
  string outputPath;
  string buildAlias;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  local_110;
  cmNinjaDeps local_c8;
  TargetAliasMap *local_a8;
  TargetAliasMap *local_a0;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  NinjaOutputPath(&local_70,this,alias);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4c])
            (&local_50,this,&local_70,config);
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = std::__cxx11::string::compare((char *)config);
  if (iVar5 != 0) {
    AppendTargetOutputs(this,target,&local_c8,config,DependOnTargetArtifact);
  }
  pbVar4 = local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a0 = &this->TargetAliases;
    local_a8 = &this->DefaultTargetAliases;
    __k = local_c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>_>
               ::operator[](local_a0,__k);
      pmVar6->GeneratorTarget = (cmGeneratorTarget *)0x0;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>_>
               ::operator[](local_a8,__k);
      pmVar6->GeneratorTarget = (cmGeneratorTarget *)0x0;
      cmMakefile::GetGeneratorConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_110,
                 (cmMakefile *)
                 (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                   super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
                 IncludeEmptyConfig);
      sVar3 = local_110.first._M_string_length;
      for (__k_00._M_p = local_110.first._M_dataplus._M_p; __k_00._M_p != (pointer)sVar3;
          __k_00._M_p = __k_00._M_p + 0x20) {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                 ::operator[](&this->Configs,(key_type *)__k_00._M_p);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>_>_>
                 ::operator[](&pmVar7->TargetAliases,__k);
        pmVar6->GeneratorTarget = (cmGeneratorTarget *)0x0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_110);
      __k = __k + 1;
    } while (__k != pbVar4);
  }
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_98 = (undefined1  [8])target;
  local_90._M_p = (pointer)&local_80;
  std::__cxx11::string::_M_assign((string *)&local_90);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGlobalNinjaGenerator::TargetAlias_&,_true>
            (&local_110,&local_50,(TargetAlias *)local_98);
  pVar9 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
                      *)&this->TargetAliases,&local_110);
  paVar1 = &local_110.second.Config.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.second.Config._M_dataplus._M_p != paVar1) {
    operator_delete(local_110.second.Config._M_dataplus._M_p,
                    local_110.second.Config.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_110.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.first._M_dataplus._M_p,
                    local_110.first.field_2._M_allocated_capacity + 1);
  }
  if ((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
     (*(cmGeneratorTarget **)(pVar9.first._M_node._M_node + 2) != target)) {
    *(undefined8 *)(pVar9.first._M_node._M_node + 2) = 0;
  }
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](&this->Configs,config);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGlobalNinjaGenerator::TargetAlias_&,_true>
            (&local_110,&local_70,(TargetAlias *)local_98);
  pVar9 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
                      *)&pmVar7->TargetAliases,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.second.Config._M_dataplus._M_p != paVar1) {
    operator_delete(local_110.second.Config._M_dataplus._M_p,
                    local_110.second.Config.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.first._M_dataplus._M_p,
                    local_110.first.field_2._M_allocated_capacity + 1);
  }
  if ((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
     (*(cmGeneratorTarget **)(pVar9.first._M_node._M_node + 2) != target)) {
    *(undefined8 *)(pVar9.first._M_node._M_node + 2) = 0;
  }
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->DefaultConfigs)._M_t,config);
  if ((_Rb_tree_header *)cVar8._M_node != &(this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::TargetAlias>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGlobalNinjaGenerator::TargetAlias_&,_true>
              (&local_110,&local_70,(TargetAlias *)local_98);
    pVar9 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,cmGlobalNinjaGenerator::TargetAlias>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGlobalNinjaGenerator::TargetAlias>>>
                        *)&this->DefaultTargetAliases,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.second.Config._M_dataplus._M_p != paVar1) {
      operator_delete(local_110.second.Config._M_dataplus._M_p,
                      local_110.second.Config.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_110.first._M_dataplus._M_p,
                      local_110.first.field_2._M_allocated_capacity + 1);
    }
    if ((((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (*(cmGeneratorTarget **)(pVar9.first._M_node._M_node + 2) != target)) {
      *(undefined8 *)(pVar9.first._M_node._M_node + 2) = 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,
                    CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddTargetAlias(const std::string& alias,
                                            cmGeneratorTarget* target,
                                            const std::string& config)
{
  std::string outputPath = this->NinjaOutputPath(alias);
  std::string buildAlias = this->BuildAlias(outputPath, config);
  cmNinjaDeps outputs;
  if (config != "all") {
    this->AppendTargetOutputs(target, outputs, config, DependOnTargetArtifact);
  }
  // Mark the target's outputs as ambiguous to ensure that no other target
  // uses the output as an alias.
  for (std::string const& output : outputs) {
    this->TargetAliases[output].GeneratorTarget = nullptr;
    this->DefaultTargetAliases[output].GeneratorTarget = nullptr;
    for (const std::string& config2 :
         this->Makefiles.front()->GetGeneratorConfigs(
           cmMakefile::IncludeEmptyConfig)) {
      this->Configs[config2].TargetAliases[output].GeneratorTarget = nullptr;
    }
  }

  // Insert the alias into the map.  If the alias was already present in the
  // map and referred to another target, mark it as ambiguous.
  TargetAlias ta;
  ta.GeneratorTarget = target;
  ta.Config = config;

  auto newAliasGlobal =
    this->TargetAliases.insert(std::make_pair(buildAlias, ta));
  if (newAliasGlobal.second &&
      newAliasGlobal.first->second.GeneratorTarget != target) {
    newAliasGlobal.first->second.GeneratorTarget = nullptr;
  }

  auto newAliasConfig =
    this->Configs[config].TargetAliases.insert(std::make_pair(outputPath, ta));
  if (newAliasConfig.second &&
      newAliasConfig.first->second.GeneratorTarget != target) {
    newAliasConfig.first->second.GeneratorTarget = nullptr;
  }
  if (this->DefaultConfigs.count(config)) {
    auto newAliasDefaultGlobal =
      this->DefaultTargetAliases.insert(std::make_pair(outputPath, ta));
    if (newAliasDefaultGlobal.second &&
        newAliasDefaultGlobal.first->second.GeneratorTarget != target) {
      newAliasDefaultGlobal.first->second.GeneratorTarget = nullptr;
    }
  }
}